

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O1

void brotli::EmitLongInsertLen
               (size_t insertlen,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (insertlen < 0x5842) {
    bVar1 = depth[0x3e];
    if (bits[0x3e] >> (bVar1 & 0x3f) == 0) {
      if (0x38 < bVar1) {
LAB_0017e5b5:
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                      ,0x2d,
                      "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                     );
      }
      uVar2 = *storage_ix;
      uVar4 = bVar1 + uVar2;
      *(ulong *)(storage + (uVar2 >> 3)) =
           (ulong)bits[0x3e] << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
      *storage_ix = uVar4;
      if (insertlen - 0x1842 < 0x4000) {
        *(size_t *)(storage + (uVar4 >> 3)) =
             insertlen - 0x1842 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
        sVar5 = uVar4 + 0xe;
        lVar3 = 0x58;
LAB_0017e58e:
        *storage_ix = sVar5;
        *(int *)((long)histo + lVar3) = *(int *)((long)histo + lVar3) + 1;
        return;
      }
    }
  }
  else {
    bVar1 = depth[0x3f];
    if (bits[0x3f] >> (bVar1 & 0x3f) == 0) {
      if (0x38 < bVar1) goto LAB_0017e5b5;
      uVar2 = *storage_ix;
      uVar4 = bVar1 + uVar2;
      *(ulong *)(storage + (uVar2 >> 3)) =
           (ulong)bits[0x3f] << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
      *storage_ix = uVar4;
      if (insertlen - 0x5842 < 0x1000000) {
        *(size_t *)(storage + (uVar4 >> 3)) =
             insertlen - 0x5842 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
        sVar5 = uVar4 + 0x18;
        lVar3 = 0x5c;
        goto LAB_0017e58e;
      }
    }
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

inline void EmitLongInsertLen(size_t insertlen,
                              const uint8_t depth[128],
                              const uint16_t bits[128],
                              uint32_t histo[128],
                              size_t* storage_ix,
                              uint8_t* storage) {
  if (insertlen < 22594) {
    WriteBits(depth[62], bits[62], storage_ix, storage);
    WriteBits(14, insertlen - 6210, storage_ix, storage);
    ++histo[22];
  } else {
    WriteBits(depth[63], bits[63], storage_ix, storage);
    WriteBits(24, insertlen - 22594, storage_ix, storage);
    ++histo[23];
  }
}